

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O3

Node * __thiscall llvm::yaml::KeyValueNode::getValue(KeyValueNode *this)

{
  TokenKind TVar1;
  Scanner *this_00;
  unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *puVar2;
  char *pcVar3;
  Node *pNVar4;
  Token *pTVar5;
  Document *pDVar6;
  Token local_70;
  Twine local_38;
  
  if (this->Value != (Node *)0x0) {
    return this->Value;
  }
  pNVar4 = getKey(this);
  if (pNVar4 == (Node *)0x0) {
    Twine::Twine(&local_38,"Null key in Key Value.");
    pTVar5 = Scanner::peekNext(*(Scanner **)
                                &((((this->super_Node).Doc)->_M_t).
                                  super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                  .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl
                                 )->stream->scanner);
    Scanner::setError(*(Scanner **)
                       &((((this->super_Node).Doc)->_M_t).
                         super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                         .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->stream
                        ->scanner,&local_38,(pTVar5->Range).Data);
LAB_00da9530:
    pDVar6 = (((this->super_Node).Doc)->_M_t).
             super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
             ._M_t.
             super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
             .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl;
  }
  else {
    (*pNVar4->_vptr_Node[1])(pNVar4);
    pDVar6 = (((this->super_Node).Doc)->_M_t).
             super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
             ._M_t.
             super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
             .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl;
    this_00 = *(Scanner **)&pDVar6->stream->scanner;
    if (this_00->Failed != true) {
      pTVar5 = Scanner::peekNext(this_00);
      TVar1 = pTVar5->Kind;
      if (TVar1 < TK_Scalar) {
        if ((0x18901U >> (TVar1 & (TK_Key|TK_FlowMappingEnd)) & 1) != 0) goto LAB_00da9530;
        if (TVar1 != TK_Value) goto LAB_00da95bc;
        Scanner::getNext(&local_70,
                         *(Scanner **)
                          &((((this->super_Node).Doc)->_M_t).
                            super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                            .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                           stream->scanner);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70.Value._M_dataplus._M_p != &local_70.Value.field_2) {
          operator_delete(local_70.Value._M_dataplus._M_p,
                          local_70.Value.field_2._M_allocated_capacity + 1);
        }
        pTVar5 = Scanner::peekNext(*(Scanner **)
                                    &((((this->super_Node).Doc)->_M_t).
                                      super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                      .super__Head_base<0UL,_llvm::yaml::Document_*,_false>.
                                     _M_head_impl)->stream->scanner);
        if ((pTVar5->Kind != TK_Key) && (pTVar5->Kind != TK_BlockEnd)) {
          pNVar4 = Document::parseBlockNode
                             ((((this->super_Node).Doc)->_M_t).
                              super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                              .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl);
          goto LAB_00da95aa;
        }
        pNVar4 = (Node *)Node::operator_new(0x48,&((((this->super_Node).Doc)->_M_t).
                                                                                                      
                                                  super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                                  .
                                                  super__Head_base<0UL,_llvm::yaml::Document_*,_false>
                                                  ._M_head_impl)->NodeAllocator,0x10);
        if (pNVar4 == (Node *)0x0) {
          pNVar4 = (Node *)0x0;
          goto LAB_00da95aa;
        }
      }
      else {
LAB_00da95bc:
        Twine::Twine(&local_38,"Unexpected token in Key Value.");
        Scanner::setError(*(Scanner **)
                           &((((this->super_Node).Doc)->_M_t).
                             super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                             .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                            stream->scanner,&local_38,(pTVar5->Range).Data);
        pNVar4 = (Node *)Node::operator_new(0x48,&((((this->super_Node).Doc)->_M_t).
                                                                                                      
                                                  super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                                  .
                                                  super__Head_base<0UL,_llvm::yaml::Document_*,_false>
                                                  ._M_head_impl)->NodeAllocator,0x10);
        if (pNVar4 == (Node *)0x0) goto LAB_00da95aa;
      }
      NullNode::NullNode((NullNode *)pNVar4,(this->super_Node).Doc);
      goto LAB_00da95aa;
    }
  }
  pNVar4 = (Node *)Node::operator_new(0x48,&pDVar6->NodeAllocator,0x10);
  if (pNVar4 != (Node *)0x0) {
    puVar2 = (this->super_Node).Doc;
    pNVar4->_vptr_Node = (_func_int **)&PTR_anchor_01079770;
    pNVar4->Doc = puVar2;
    (pNVar4->SourceRange).Start.Ptr = (char *)0x0;
    (pNVar4->SourceRange).End.Ptr = (char *)0x0;
    pNVar4->TypeID = 0;
    (pNVar4->Anchor).Data = (char *)0x0;
    (pNVar4->Anchor).Length = 0;
    (pNVar4->Tag).Data = (char *)0x0;
    (pNVar4->Tag).Length = 0;
    pTVar5 = Scanner::peekNext(*(Scanner **)
                                &((puVar2->_M_t).
                                  super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                  .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl
                                 )->stream->scanner);
    pcVar3 = (pTVar5->Range).Data;
    (pNVar4->SourceRange).Start.Ptr = pcVar3;
    (pNVar4->SourceRange).End.Ptr = pcVar3;
    pNVar4->_vptr_Node = (_func_int **)&PTR_anchor_01079790;
  }
LAB_00da95aa:
  this->Value = pNVar4;
  return pNVar4;
}

Assistant:

Node *KeyValueNode::getValue() {
  if (Value)
    return Value;

  if (Node* Key = getKey())
    Key->skip();
  else {
    setError("Null key in Key Value.", peekNext());
    return Value = new (getAllocator()) NullNode(Doc);
  }

  if (failed())
    return Value = new (getAllocator()) NullNode(Doc);

  // Handle implicit null values.
  {
    Token &t = peekNext();
    if (   t.Kind == Token::TK_BlockEnd
        || t.Kind == Token::TK_FlowMappingEnd
        || t.Kind == Token::TK_Key
        || t.Kind == Token::TK_FlowEntry
        || t.Kind == Token::TK_Error) {
      return Value = new (getAllocator()) NullNode(Doc);
    }

    if (t.Kind != Token::TK_Value) {
      setError("Unexpected token in Key Value.", t);
      return Value = new (getAllocator()) NullNode(Doc);
    }
    getNext(); // skip TK_Value.
  }

  // Handle explicit null values.
  Token &t = peekNext();
  if (t.Kind == Token::TK_BlockEnd || t.Kind == Token::TK_Key) {
    return Value = new (getAllocator()) NullNode(Doc);
  }

  // We got a normal value.
  return Value = parseBlockNode();
}